

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O1

bool isCompressedFormat(TextureFormat internalFormat)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  undefined1 extraout_AL;
  int iVar4;
  code *pcVar5;
  byte bVar6;
  int in_ECX;
  uint uVar7;
  ulong in_RDX;
  undefined8 uVar8;
  int iVar9;
  int in_ESI;
  undefined8 *puVar10;
  long *plVar11;
  CubeMapFace in_R8D;
  PixelFormat in_R9D;
  QOpenGLTextureHelper *pQVar12;
  int iVar13;
  long in_FS_OFFSET;
  PixelType in_stack_00000008;
  void *in_stack_00000010;
  QOpenGLPixelTransferOptions *in_stack_00000018;
  ulong uStack_48;
  QSharedDataPointer<QOpenGLPixelTransferOptionsData> QStack_40;
  TextureParameteriMemberFunc TStack_38;
  
  bVar3 = false;
  if ((int)internalFormat < 0x8d88) {
    if ((int)internalFormat < 0x83f0) {
      if ((int)internalFormat < 0x8051) {
        if ((8 < internalFormat - DepthFormat) ||
           ((0x1f1U >> (internalFormat - DepthFormat & 0x1f) & 1) == 0)) {
          return bVar3;
        }
      }
      else if ((0x13 < internalFormat - R8_UNorm) && (internalFormat - RGB8_UNorm < 0xb)) {
        return bVar3;
      }
switchD_00155775_caseD_0:
      return bVar3;
    }
    if (0x8c4b < (int)internalFormat) {
      uVar7 = internalFormat - S8;
      if (uVar7 < 0x3c) {
        if ((0xc30c30004000001U >> ((ulong)uVar7 & 0x3f) & 1) != 0) {
          return bVar3;
        }
        if ((ulong)uVar7 == 0x1c) {
          return true;
        }
      }
      if (3 < internalFormat - SRGB_DXT1) {
        return bVar3;
      }
      return true;
    }
    if ((int)internalFormat < 0x88f0) {
      if (internalFormat - RGB_DXT1 < 4) {
        return true;
      }
      if ((0xc3U >> (internalFormat - RGBA32F & 0x1f) & 1) != 0) {
        return bVar3;
      }
      QOpenGLTexturePrivate::setData
                ((QOpenGLTexturePrivate *)(ulong)(internalFormat - RGBA32F),in_ESI,(int)in_RDX,0xc3,
                 in_R8D,in_R9D,in_stack_00000008,in_stack_00000010,in_stack_00000018);
      return (bool)extraout_AL;
    }
    puVar10 = (undefined8 *)(ulong)(internalFormat - RG11B10F);
    if (9 < internalFormat - RG11B10F) {
      return bVar3;
    }
    in_ECX = 0x180640;
    in_RDX = (long)&switchD_00155775::switchdataD_00180640 +
             (long)(int)(&switchD_00155775::switchdataD_00180640)[(long)puVar10];
    switch(puVar10) {
    case (undefined8 *)0x0:
    case (undefined8 *)0x3:
      goto switchD_00155775_caseD_0;
    case (undefined8 *)0x7:
    case (undefined8 *)0x9:
      goto switchD_00155775_caseD_7;
    }
  }
  else {
    if ((int)internalFormat < 0x93b0) {
      if ((int)internalFormat < 0x8f94) {
        if ((internalFormat - RGBA16I < 0x37) &&
           ((0xc3UL >> ((ulong)(internalFormat - RGBA16I) & 0x3f) & 1) != 0)) {
          return bVar3;
        }
      }
      else if (9 < internalFormat - R11_EAC_UNorm) {
        return bVar3;
      }
switchD_00155775_caseD_7:
      return true;
    }
    puVar10 = (undefined8 *)(ulong)(internalFormat - RGBA_ASTC_4x4);
    if ((0x3fff00003fffU >> ((ulong)puVar10 & 0x3f) & 1) != 0) {
      return true;
    }
  }
  TStack_38 = *(TextureParameteriMemberFunc *)(in_FS_OFFSET + 0x28);
  iVar13 = *(int *)(puVar10 + 2);
  bVar6 = (byte)in_ESI;
  uStack_48 = in_RDX;
  iVar9 = in_ESI;
  if (iVar13 < 0x8513) {
    if (iVar13 < 0x806f) {
      if (iVar13 == 0xde0) {
        pQVar12 = (QOpenGLTextureHelper *)puVar10[0x16];
        uVar1 = *(undefined4 *)((long)puVar10 + 0x14);
        uVar2 = *(undefined4 *)(puVar10 + 3);
        iVar9 = *(int *)((long)puVar10 + 0x24) >> (bVar6 & 0x1f);
        iVar13 = 1;
        if (1 < iVar9) {
          iVar13 = iVar9;
        }
        if (in_stack_00000018 == (QOpenGLPixelTransferOptions *)0x0) {
          pcVar5 = (code *)pQVar12->TextureSubImage1D;
          plVar11 = (long *)((long)&pQVar12->functions + *(long *)&pQVar12->field_0x100);
          if (((ulong)pcVar5 & 1) != 0) {
            pcVar5 = *(code **)(pcVar5 + *plVar11 + -1);
          }
          (*pcVar5)(plVar11,uVar2,0xde0,uVar1,in_ESI,0,iVar13,in_R9D,in_stack_00000008);
          goto LAB_00155e05;
        }
        QStack_40.d.ptr =
             (totally_ordered_wrapper<QOpenGLPixelTransferOptionsData_*>)&DAT_aaaaaaaaaaaaaaaa;
        QOpenGLTextureHelper::savePixelUploadOptions
                  ((QOpenGLTextureHelper *)&stack0xffffffffffffffc0);
        QOpenGLTextureHelper::setPixelUploadOptions(pQVar12,in_stack_00000018);
        pcVar5 = (code *)pQVar12->TextureSubImage1D;
        plVar11 = (long *)((long)&pQVar12->functions + *(long *)&pQVar12->field_0x100);
        if (((ulong)pcVar5 & 1) != 0) {
          pcVar5 = *(code **)(pcVar5 + *plVar11 + -1);
        }
        (*pcVar5)(plVar11,uVar2,0xde0,uVar1,in_ESI,0,iVar13,in_R9D,in_stack_00000008,
                  in_stack_00000010);
        goto LAB_00155de9;
      }
      if (iVar13 != 0xde1) goto LAB_00155e05;
      pQVar12 = (QOpenGLTextureHelper *)puVar10[0x16];
      uVar1 = *(undefined4 *)((long)puVar10 + 0x14);
      uVar2 = *(undefined4 *)(puVar10 + 3);
      iVar13 = *(int *)((long)puVar10 + 0x24) >> (bVar6 & 0x1f);
      if (iVar13 < 2) {
        iVar13 = 1;
      }
      in_ECX = *(int *)(puVar10 + 5) >> (bVar6 & 0x1f);
      if (in_ECX < 2) {
        in_ECX = 1;
      }
      if (in_stack_00000018 == (QOpenGLPixelTransferOptions *)0x0) {
        pcVar5 = (code *)pQVar12->TextureSubImage2D;
        plVar11 = (long *)((long)&pQVar12->functions + *(long *)&pQVar12->field_0xf0);
        if (((ulong)pcVar5 & 1) != 0) {
          pcVar5 = *(code **)(pcVar5 + *plVar11 + -1);
        }
        in_R8D = 0xde1;
        goto LAB_00155f3c;
      }
      QStack_40.d.ptr =
           (totally_ordered_wrapper<QOpenGLPixelTransferOptionsData_*>)&DAT_aaaaaaaaaaaaaaaa;
      QOpenGLTextureHelper::savePixelUploadOptions((QOpenGLTextureHelper *)&stack0xffffffffffffffc0)
      ;
      QOpenGLTextureHelper::setPixelUploadOptions(pQVar12,in_stack_00000018);
      pcVar5 = (code *)pQVar12->TextureSubImage2D;
      plVar11 = (long *)((long)&pQVar12->functions + *(long *)&pQVar12->field_0xf0);
      if (((ulong)pcVar5 & 1) != 0) {
        pcVar5 = *(code **)(pcVar5 + *plVar11 + -1);
      }
      uVar8 = 0xde1;
    }
    else {
      if (iVar13 == 0x806f) {
        pQVar12 = (QOpenGLTextureHelper *)puVar10[0x16];
        uVar1 = *(undefined4 *)((long)puVar10 + 0x14);
        uVar2 = *(undefined4 *)(puVar10 + 3);
        iVar13 = *(int *)((long)puVar10 + 0x24) >> (bVar6 & 0x1f);
        if (iVar13 < 2) {
          iVar13 = 1;
        }
        iVar9 = *(int *)(puVar10 + 5) >> (bVar6 & 0x1f);
        if (iVar9 < 2) {
          iVar9 = 1;
        }
        in_ECX = *(int *)((long)puVar10 + 0x2c) >> (bVar6 & 0x1f);
        if (in_ECX < 2) {
          in_ECX = 1;
        }
        if (in_stack_00000018 == (QOpenGLPixelTransferOptions *)0x0) {
          pcVar5 = (code *)pQVar12->TextureSubImage3D;
          plVar11 = (long *)((long)&pQVar12->functions + *(long *)&pQVar12->field_0xe0);
          if (((ulong)pcVar5 & 1) != 0) {
            pcVar5 = *(code **)(pcVar5 + *plVar11 + -1);
          }
          uVar8 = 0x806f;
          goto LAB_0015603b;
        }
        QStack_40.d.ptr =
             (totally_ordered_wrapper<QOpenGLPixelTransferOptionsData_*>)&DAT_aaaaaaaaaaaaaaaa;
        QOpenGLTextureHelper::savePixelUploadOptions
                  ((QOpenGLTextureHelper *)&stack0xffffffffffffffc0);
        QOpenGLTextureHelper::setPixelUploadOptions(pQVar12,in_stack_00000018);
        pcVar5 = (code *)pQVar12->TextureSubImage3D;
        plVar11 = (long *)((long)&pQVar12->functions + *(long *)&pQVar12->field_0xe0);
        if (((ulong)pcVar5 & 1) != 0) {
          pcVar5 = *(code **)(pcVar5 + *plVar11 + -1);
        }
        uVar8 = 0x806f;
        goto LAB_00155ddd;
      }
      if (iVar13 != 0x84f5) goto LAB_00155e05;
      pQVar12 = (QOpenGLTextureHelper *)puVar10[0x16];
      uVar1 = *(undefined4 *)((long)puVar10 + 0x14);
      uVar2 = *(undefined4 *)(puVar10 + 3);
      iVar13 = *(int *)((long)puVar10 + 0x24);
      in_ECX = *(int *)(puVar10 + 5);
      if (in_stack_00000018 == (QOpenGLPixelTransferOptions *)0x0) {
        pcVar5 = (code *)pQVar12->TextureSubImage2D;
        plVar11 = (long *)((long)&pQVar12->functions + *(long *)&pQVar12->field_0xf0);
        if (((ulong)pcVar5 & 1) != 0) {
          pcVar5 = *(code **)(pcVar5 + *plVar11 + -1);
        }
        (*pcVar5)(plVar11,uVar2,0x84f5,uVar1,0,0,0,iVar13,in_ECX,in_R9D,in_stack_00000008);
        goto LAB_00155e05;
      }
      QStack_40.d.ptr =
           (totally_ordered_wrapper<QOpenGLPixelTransferOptionsData_*>)&DAT_aaaaaaaaaaaaaaaa;
      QOpenGLTextureHelper::savePixelUploadOptions((QOpenGLTextureHelper *)&stack0xffffffffffffffc0)
      ;
      QOpenGLTextureHelper::setPixelUploadOptions(pQVar12,in_stack_00000018);
      pcVar5 = (code *)pQVar12->TextureSubImage2D;
      plVar11 = (long *)((long)&pQVar12->functions + *(long *)&pQVar12->field_0xf0);
      if (((ulong)pcVar5 & 1) != 0) {
        pcVar5 = *(code **)(pcVar5 + *plVar11 + -1);
      }
      uVar8 = 0x84f5;
      iVar9 = 0;
    }
    in_RDX = 0;
LAB_00155ad8:
    (*pcVar5)(plVar11,uVar2,uVar8,uVar1,iVar9,0,in_RDX,iVar13,in_ECX,in_R9D,in_stack_00000008,
              in_stack_00000010);
LAB_00155de9:
    QOpenGLTextureHelper::setPixelUploadOptions
              (pQVar12,(QOpenGLPixelTransferOptions *)&stack0xffffffffffffffc0);
  }
  else {
    if (0x8c19 < iVar13) {
      if (iVar13 < 0x9009) {
        if (iVar13 != 0x8c1a) {
          if (iVar13 != 0x8c2a) goto LAB_00155e05;
          goto LAB_0015606d;
        }
        pQVar12 = (QOpenGLTextureHelper *)puVar10[0x16];
        uVar1 = *(undefined4 *)((long)puVar10 + 0x14);
        uVar2 = *(undefined4 *)(puVar10 + 3);
        iVar13 = *(int *)((long)puVar10 + 0x24) >> (bVar6 & 0x1f);
        if (iVar13 < 2) {
          iVar13 = 1;
        }
        iVar9 = *(int *)(puVar10 + 5) >> (bVar6 & 0x1f);
        if (iVar9 < 2) {
          iVar9 = 1;
        }
        if (in_stack_00000018 == (QOpenGLPixelTransferOptions *)0x0) {
          pcVar5 = (code *)pQVar12->TextureSubImage3D;
          plVar11 = (long *)((long)&pQVar12->functions + *(long *)&pQVar12->field_0xe0);
          if (((ulong)pcVar5 & 1) != 0) {
            pcVar5 = *(code **)(pcVar5 + *plVar11 + -1);
          }
          uVar8 = 0x8c1a;
          goto LAB_0015603b;
        }
        QStack_40.d.ptr =
             (totally_ordered_wrapper<QOpenGLPixelTransferOptionsData_*>)&DAT_aaaaaaaaaaaaaaaa;
        QOpenGLTextureHelper::savePixelUploadOptions
                  ((QOpenGLTextureHelper *)&stack0xffffffffffffffc0);
        QOpenGLTextureHelper::setPixelUploadOptions(pQVar12,in_stack_00000018);
        pcVar5 = (code *)pQVar12->TextureSubImage3D;
        plVar11 = (long *)((long)&pQVar12->functions + *(long *)&pQVar12->field_0xe0);
        if (((ulong)pcVar5 & 1) != 0) {
          pcVar5 = *(code **)(pcVar5 + *plVar11 + -1);
        }
        uVar8 = 0x8c1a;
      }
      else {
        if (iVar13 != 0x9009) {
          if ((iVar13 != 0x9100) && (iVar13 != 0x9102)) goto LAB_00155e05;
LAB_0015606d:
          QOpenGLTexturePrivate::setData();
          goto LAB_00155e05;
        }
        in_RDX = (ulong)((in_R8D + (int)in_RDX * 6) - 0x8515);
        pQVar12 = (QOpenGLTextureHelper *)puVar10[0x16];
        uVar1 = *(undefined4 *)((long)puVar10 + 0x14);
        uVar2 = *(undefined4 *)(puVar10 + 3);
        iVar13 = *(int *)((long)puVar10 + 0x24) >> (bVar6 & 0x1f);
        if (iVar13 < 2) {
          iVar13 = 1;
        }
        iVar9 = *(int *)(puVar10 + 5) >> (bVar6 & 0x1f);
        if (iVar9 < 2) {
          iVar9 = 1;
        }
        if (in_stack_00000018 == (QOpenGLPixelTransferOptions *)0x0) {
          pcVar5 = (code *)pQVar12->TextureSubImage3D;
          plVar11 = (long *)((long)&pQVar12->functions + *(long *)&pQVar12->field_0xe0);
          if (((ulong)pcVar5 & 1) != 0) {
            pcVar5 = *(code **)(pcVar5 + *plVar11 + -1);
          }
          uVar8 = 0x9009;
LAB_0015603b:
          (*pcVar5)(plVar11,uVar2,uVar8,uVar1,in_ESI,0,0,in_RDX,iVar13,iVar9,in_ECX,in_R9D,
                    in_stack_00000008);
          goto LAB_00155e05;
        }
        QStack_40.d.ptr =
             (totally_ordered_wrapper<QOpenGLPixelTransferOptionsData_*>)&DAT_aaaaaaaaaaaaaaaa;
        QOpenGLTextureHelper::savePixelUploadOptions
                  ((QOpenGLTextureHelper *)&stack0xffffffffffffffc0);
        QOpenGLTextureHelper::setPixelUploadOptions(pQVar12,in_stack_00000018);
        pcVar5 = (code *)pQVar12->TextureSubImage3D;
        plVar11 = (long *)((long)&pQVar12->functions + *(long *)&pQVar12->field_0xe0);
        if (((ulong)pcVar5 & 1) != 0) {
          pcVar5 = *(code **)(pcVar5 + *plVar11 + -1);
        }
        uVar8 = 0x9009;
        uStack_48 = in_RDX;
      }
LAB_00155ddd:
      (*pcVar5)(plVar11,uVar2,uVar8,uVar1,in_ESI,0,0,uStack_48,iVar13,iVar9,in_ECX,in_R9D,
                in_stack_00000008,in_stack_00000010);
      goto LAB_00155de9;
    }
    if (iVar13 != 0x8513) {
      if (iVar13 != 0x8c18) goto LAB_00155e05;
      pQVar12 = (QOpenGLTextureHelper *)puVar10[0x16];
      uVar1 = *(undefined4 *)((long)puVar10 + 0x14);
      uVar2 = *(undefined4 *)(puVar10 + 3);
      iVar4 = *(int *)((long)puVar10 + 0x24) >> (bVar6 & 0x1f);
      iVar13 = 1;
      if (1 < iVar4) {
        iVar13 = iVar4;
      }
      if (in_stack_00000018 == (QOpenGLPixelTransferOptions *)0x0) {
        pcVar5 = (code *)pQVar12->TextureSubImage2D;
        plVar11 = (long *)((long)&pQVar12->functions + *(long *)&pQVar12->field_0xf0);
        if (((ulong)pcVar5 & 1) != 0) {
          pcVar5 = *(code **)(pcVar5 + *plVar11 + -1);
        }
        in_R8D = 0x8c18;
        goto LAB_00155f3e;
      }
      QStack_40.d.ptr =
           (totally_ordered_wrapper<QOpenGLPixelTransferOptionsData_*>)&DAT_aaaaaaaaaaaaaaaa;
      QOpenGLTextureHelper::savePixelUploadOptions((QOpenGLTextureHelper *)&stack0xffffffffffffffc0)
      ;
      QOpenGLTextureHelper::setPixelUploadOptions(pQVar12,in_stack_00000018);
      pcVar5 = (code *)pQVar12->TextureSubImage2D;
      plVar11 = (long *)((long)&pQVar12->functions + *(long *)&pQVar12->field_0xf0);
      if (((ulong)pcVar5 & 1) != 0) {
        pcVar5 = *(code **)(pcVar5 + *plVar11 + -1);
      }
      uVar8 = 0x8c18;
      goto LAB_00155ad8;
    }
    pQVar12 = (QOpenGLTextureHelper *)puVar10[0x16];
    uVar1 = *(undefined4 *)((long)puVar10 + 0x14);
    uVar2 = *(undefined4 *)(puVar10 + 3);
    iVar13 = *(int *)((long)puVar10 + 0x24) >> (bVar6 & 0x1f);
    if (iVar13 < 2) {
      iVar13 = 1;
    }
    in_ECX = *(int *)(puVar10 + 5) >> (bVar6 & 0x1f);
    if (in_ECX < 2) {
      in_ECX = 1;
    }
    if (in_stack_00000018 == (QOpenGLPixelTransferOptions *)0x0) {
      pcVar5 = (code *)pQVar12->TextureSubImage2D;
      plVar11 = (long *)((long)&pQVar12->functions + *(long *)&pQVar12->field_0xf0);
      if (((ulong)pcVar5 & 1) != 0) {
        pcVar5 = *(code **)(pcVar5 + *plVar11 + -1);
      }
LAB_00155f3c:
      in_RDX = 0;
LAB_00155f3e:
      (*pcVar5)(plVar11,uVar2,in_R8D,uVar1,in_ESI,0,in_RDX,iVar13,in_ECX,in_R9D,in_stack_00000008);
      goto LAB_00155e05;
    }
    QStack_40.d.ptr =
         (totally_ordered_wrapper<QOpenGLPixelTransferOptionsData_*>)&DAT_aaaaaaaaaaaaaaaa;
    QOpenGLTextureHelper::savePixelUploadOptions((QOpenGLTextureHelper *)&stack0xffffffffffffffc0);
    QOpenGLTextureHelper::setPixelUploadOptions(pQVar12,in_stack_00000018);
    pcVar5 = (code *)pQVar12->TextureSubImage2D;
    plVar11 = (long *)((long)&pQVar12->functions + *(long *)&pQVar12->field_0xf0);
    if (((ulong)pcVar5 & 1) != 0) {
      pcVar5 = *(code **)(pcVar5 + *plVar11 + -1);
    }
    (*pcVar5)(plVar11,uVar2,in_R8D,uVar1,in_ESI,0,0,iVar13,in_ECX,in_R9D,in_stack_00000008,
              in_stack_00000010);
    QOpenGLTextureHelper::setPixelUploadOptions
              (pQVar12,(QOpenGLPixelTransferOptions *)&stack0xffffffffffffffc0);
  }
  QOpenGLPixelTransferOptions::~QOpenGLPixelTransferOptions
            ((QOpenGLPixelTransferOptions *)&stack0xffffffffffffffc0);
LAB_00155e05:
  if (((in_ESI == 0) && (*(char *)((long)puVar10 + 0xad) == '\x01')) &&
     (1 < *(int *)((long)puVar10 + 0x34))) {
    QOpenGLTexture::generateMipMaps((QOpenGLTexture *)*puVar10);
  }
  if (*(TextureParameteriMemberFunc *)(in_FS_OFFSET + 0x28) == TStack_38) {
    return SUB81(*(TextureParameteriMemberFunc *)(in_FS_OFFSET + 0x28),0);
  }
  __stack_chk_fail();
}

Assistant:

static bool isCompressedFormat(QOpenGLTexture::TextureFormat internalFormat)
{
    switch (internalFormat) {
    case QOpenGLTexture::NoFormat:

    case QOpenGLTexture::R8_UNorm:
    case QOpenGLTexture::RG8_UNorm:
    case QOpenGLTexture::RGB8_UNorm:
    case QOpenGLTexture::RGBA8_UNorm:
    case QOpenGLTexture::R16_UNorm:
    case QOpenGLTexture::RG16_UNorm:
    case QOpenGLTexture::RGB16_UNorm:
    case QOpenGLTexture::RGBA16_UNorm:
    case QOpenGLTexture::R8_SNorm:
    case QOpenGLTexture::RG8_SNorm:
    case QOpenGLTexture::RGB8_SNorm:
    case QOpenGLTexture::RGBA8_SNorm:
    case QOpenGLTexture::R16_SNorm:
    case QOpenGLTexture::RG16_SNorm:
    case QOpenGLTexture::RGB16_SNorm:
    case QOpenGLTexture::RGBA16_SNorm:
    case QOpenGLTexture::R8U:
    case QOpenGLTexture::RG8U:
    case QOpenGLTexture::RGB8U:
    case QOpenGLTexture::RGBA8U:
    case QOpenGLTexture::R16U:
    case QOpenGLTexture::RG16U:
    case QOpenGLTexture::RGB16U:
    case QOpenGLTexture::RGBA16U:
    case QOpenGLTexture::R32U:
    case QOpenGLTexture::RG32U:
    case QOpenGLTexture::RGB32U:
    case QOpenGLTexture::RGBA32U:
    case QOpenGLTexture::R8I:
    case QOpenGLTexture::RG8I:
    case QOpenGLTexture::RGB8I:
    case QOpenGLTexture::RGBA8I:
    case QOpenGLTexture::R16I:
    case QOpenGLTexture::RG16I:
    case QOpenGLTexture::RGB16I:
    case QOpenGLTexture::RGBA16I:
    case QOpenGLTexture::R32I:
    case QOpenGLTexture::RG32I:
    case QOpenGLTexture::RGB32I:
    case QOpenGLTexture::RGBA32I:
    case QOpenGLTexture::R16F:
    case QOpenGLTexture::RG16F:
    case QOpenGLTexture::RGB16F:
    case QOpenGLTexture::RGBA16F:
    case QOpenGLTexture::R32F:
    case QOpenGLTexture::RG32F:
    case QOpenGLTexture::RGB32F:
    case QOpenGLTexture::RGBA32F:
    case QOpenGLTexture::RGB9E5:
    case QOpenGLTexture::RG11B10F:
    case QOpenGLTexture::RG3B2:
    case QOpenGLTexture::R5G6B5:
    case QOpenGLTexture::RGB5A1:
    case QOpenGLTexture::RGBA4:
    case QOpenGLTexture::RGB10A2:

    case QOpenGLTexture::D16:
    case QOpenGLTexture::D24:
    case QOpenGLTexture::D32:
    case QOpenGLTexture::D32F:

    case QOpenGLTexture::D24S8:
    case QOpenGLTexture::D32FS8X24:

    case QOpenGLTexture::S8:
        return false;

    case QOpenGLTexture::RGB_DXT1:
    case QOpenGLTexture::RGBA_DXT1:
    case QOpenGLTexture::RGBA_DXT3:
    case QOpenGLTexture::RGBA_DXT5:
    case QOpenGLTexture::R_ATI1N_UNorm:
    case QOpenGLTexture::R_ATI1N_SNorm:
    case QOpenGLTexture::RG_ATI2N_UNorm:
    case QOpenGLTexture::RG_ATI2N_SNorm:
    case QOpenGLTexture::RGB_BP_UNSIGNED_FLOAT:
    case QOpenGLTexture::RGB_BP_SIGNED_FLOAT:
    case QOpenGLTexture::RGB_BP_UNorm:
    case QOpenGLTexture::SRGB8:
    case QOpenGLTexture::SRGB8_Alpha8:
    case QOpenGLTexture::SRGB_DXT1:
    case QOpenGLTexture::SRGB_Alpha_DXT1:
    case QOpenGLTexture::SRGB_Alpha_DXT3:
    case QOpenGLTexture::SRGB_Alpha_DXT5:
    case QOpenGLTexture::SRGB_BP_UNorm:
    case QOpenGLTexture::R11_EAC_UNorm:
    case QOpenGLTexture::R11_EAC_SNorm:
    case QOpenGLTexture::RG11_EAC_UNorm:
    case QOpenGLTexture::RG11_EAC_SNorm:
    case QOpenGLTexture::RGB8_ETC2:
    case QOpenGLTexture::SRGB8_ETC2:
    case QOpenGLTexture::RGB8_PunchThrough_Alpha1_ETC2:
    case QOpenGLTexture::SRGB8_PunchThrough_Alpha1_ETC2:
    case QOpenGLTexture::RGBA8_ETC2_EAC:
    case QOpenGLTexture::SRGB8_Alpha8_ETC2_EAC:
    case QOpenGLTexture::RGB8_ETC1:
    case QOpenGLTexture::RGBA_ASTC_4x4:
    case QOpenGLTexture::RGBA_ASTC_5x4:
    case QOpenGLTexture::RGBA_ASTC_5x5:
    case QOpenGLTexture::RGBA_ASTC_6x5:
    case QOpenGLTexture::RGBA_ASTC_6x6:
    case QOpenGLTexture::RGBA_ASTC_8x5:
    case QOpenGLTexture::RGBA_ASTC_8x6:
    case QOpenGLTexture::RGBA_ASTC_8x8:
    case QOpenGLTexture::RGBA_ASTC_10x5:
    case QOpenGLTexture::RGBA_ASTC_10x6:
    case QOpenGLTexture::RGBA_ASTC_10x8:
    case QOpenGLTexture::RGBA_ASTC_10x10:
    case QOpenGLTexture::RGBA_ASTC_12x10:
    case QOpenGLTexture::RGBA_ASTC_12x12:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_4x4:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_5x4:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_5x5:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_6x5:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_6x6:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_8x5:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_8x6:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_8x8:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_10x5:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_10x6:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_10x8:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_10x10:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_12x10:
    case QOpenGLTexture::SRGB8_Alpha8_ASTC_12x12:
        return true;

    case QOpenGLTexture::DepthFormat:
    case QOpenGLTexture::AlphaFormat:
    case QOpenGLTexture::RGBFormat:
    case QOpenGLTexture::RGBAFormat:
    case QOpenGLTexture::LuminanceFormat:
    case QOpenGLTexture::LuminanceAlphaFormat:
        return false;
    }

    Q_UNREACHABLE_RETURN(false);
}